

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  ArrayIndex index;
  ArrayIndex AVar1;
  PathArgument *arg;
  pointer key;
  Value *pVVar2;
  
  for (key = (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_start; pVVar2 = root,
      key != (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_finish; key = key + 1) {
    pVVar2 = defaultValue;
    if (key->kind_ == kindKey) {
      if ((root->field_0x8 != '\a') ||
         (root = Value::operator[](root,&key->key_), root == (Value *)kNull)) break;
    }
    else if (key->kind_ == kindIndex) {
      if (root->field_0x8 != '\x06') break;
      index = key->index_;
      AVar1 = Value::size(root);
      if (AVar1 <= index) break;
      root = Value::operator[](root,index);
    }
  }
  Value::Value(__return_storage_ptr__,pVVar2);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::null)
        return defaultValue;
    }
  }
  return *node;
}